

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

int Wln_RetRemoveOneFanin(Wln_Ret_t *p,int iObj)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  Wln_Ntk_t *pWVar6;
  Wln_Vec_t *pWVar7;
  int *piVar8;
  int *piVar9;
  uint uVar10;
  int *piVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  
  if ((-1 < iObj) && (uVar10 = (p->vFanins).nSize, iObj < (int)uVar10)) {
    piVar5 = (p->vFanins).pArray;
    uVar1 = piVar5[(uint)iObj];
    if (((long)(int)uVar1 < 0) || (uVar10 <= uVar1)) {
LAB_00365a26:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    pWVar6 = p->pNtk;
    pWVar7 = pWVar6->vFanins;
    iVar12 = pWVar7[(uint)iObj].nSize;
    if (iVar12 < 1) {
      uVar10 = 0xffffffff;
    }
    else {
      piVar11 = piVar5 + 1;
      uVar10 = 0xffffffff;
      lVar15 = 0;
      do {
        uVar2 = (p->vFanins).nSize;
        if ((int)uVar2 <= iObj) goto LAB_00365a07;
        lVar16 = (long)piVar5[(uint)iObj];
        if ((lVar16 < 0) || (uVar2 <= (uint)piVar5[(uint)iObj])) goto LAB_00365a26;
        iVar3 = piVar11[lVar16 + -1];
        lVar13 = (long)iVar3;
        if (lVar13 != 0) {
          if (pWVar7[lVar13].nSize == 0) {
            if ((iVar3 < 0) || (iVar14 = (pWVar6->vTypes).nSize, iVar14 <= iVar3))
            goto LAB_00365a07;
            if ((pWVar6->vTypes).pArray[lVar13] != 3) goto LAB_003659de;
          }
          else {
            iVar14 = (pWVar6->vTypes).nSize;
          }
          if (iVar14 <= iObj) goto LAB_00365a07;
          piVar8 = (pWVar6->vTypes).pArray;
          if ((lVar15 == 0) || (piVar8[(uint)iObj] != 0x59)) {
            uVar2 = piVar11[lVar16];
            if ((ulong)uVar2 == 0) {
              __assert_fail("pLink[0]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                            ,0x1b0,"int Wln_RetRemoveOneFanin(Wln_Ret_t *, int)");
            }
            if ((((int)uVar2 < -1) || ((p->vEdgeLinks).nSize <= (int)(uVar2 + 1))) ||
               ((int)uVar2 < 0)) goto LAB_00365a07;
            piVar9 = (p->vEdgeLinks).pArray;
            uVar4 = piVar9[uVar2 + 1];
            piVar11[(int)uVar1] = piVar9[uVar2];
            if (((int)uVar4 < 0) || ((pWVar6->vTypes).nSize <= (int)uVar4)) goto LAB_00365a07;
            if (piVar8[uVar4] != 0x59) {
              __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                            ,0x1b3,"int Wln_RetRemoveOneFanin(Wln_Ret_t *, int)");
            }
            if (uVar10 != 0xffffffff) {
              uVar4 = uVar10;
            }
            uVar10 = uVar4;
            iVar12 = pWVar7[(uint)iObj].nSize;
          }
        }
LAB_003659de:
        lVar15 = lVar15 + 1;
        piVar11 = piVar11 + 2;
      } while (lVar15 < iVar12);
    }
    return uVar10;
  }
LAB_00365a07:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Wln_RetRemoveOneFanin( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, iFlop, iFlop1 = -1;
    int * pFanins  = Wln_RetFanins( p, iObj );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        if ( Wln_ObjIsFf(p->pNtk, iObj) && k > 0 )
            continue;
        assert( pLink[0] );
        iFlop = Vec_IntEntry( &p->vEdgeLinks, pLink[0] + 1 );
        pFanins[2*k+1] = Vec_IntEntry( &p->vEdgeLinks, pLink[0] );
        assert( Wln_ObjIsFf( p->pNtk, iFlop ) );
        if ( iFlop1 == -1 )
            iFlop1 = iFlop;
    }
    return iFlop1;
}